

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

void __thiscall cmDefinitions::Set(cmDefinitions *this,string *key,char *value)

{
  mapped_type *this_00;
  undefined1 local_48 [8];
  Def def;
  char *value_local;
  string *key_local;
  cmDefinitions *this_local;
  
  def._32_8_ = value;
  Def::Def((Def *)local_48,value);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
            ::operator[](&this->Map,key);
  Def::operator=(this_00,(Def *)local_48);
  Def::~Def((Def *)local_48);
  return;
}

Assistant:

void cmDefinitions::Set(const std::string& key, const char* value)
{
  Def def(value);
  this->Map[key] = def;
}